

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agency.c
# Opt level: O0

void init_agency(agency_t *record)

{
  agency_t *record_local;
  
  strcpy(record->id,"");
  strcpy(record->name,"");
  strcpy(record->url,"");
  strcpy(record->timezone,"");
  strcpy(record->lang,"");
  strcpy(record->phone,"");
  strcpy(record->fare_url,"");
  strcpy(record->email,"");
  return;
}

Assistant:

void init_agency(agency_t *record) {
    strcpy(record->id, "");
    strcpy(record->name, "");
    strcpy(record->url, "");
    strcpy(record->timezone, "");
    strcpy(record->lang, "");
    strcpy(record->phone, "");
    strcpy(record->fare_url, "");
    strcpy(record->email, "");
}